

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLongStressCase.cpp
# Opt level: O0

void __thiscall
deqp::gls::LongStressCaseInternal::Program::setSources
          (Program *this,string *vertSource,string *fragSource)

{
  GLchar *local_30;
  char *fragSourceCstr;
  char *vertSourceCstr;
  string *fragSource_local;
  string *vertSource_local;
  Program *this_local;
  
  vertSourceCstr = (char *)fragSource;
  fragSource_local = vertSource;
  vertSource_local = &this->m_vertSource;
  fragSourceCstr = (char *)std::__cxx11::string::c_str();
  local_30 = (GLchar *)std::__cxx11::string::c_str();
  std::__cxx11::string::operator=((string *)this,(string *)fragSource_local);
  std::__cxx11::string::operator=((string *)&this->m_fragSource,(string *)vertSourceCstr);
  glwShaderSource(this->m_vertShaderGL,1,&fragSourceCstr,(GLint *)0x0);
  glwShaderSource(this->m_fragShaderGL,1,&local_30,(GLint *)0x0);
  this->m_hasSources = true;
  return;
}

Assistant:

void Program::setSources (const string& vertSource, const string& fragSource)
{
	const char* const vertSourceCstr = vertSource.c_str();
	const char* const fragSourceCstr = fragSource.c_str();

	m_vertSource = vertSource;
	m_fragSource = fragSource;

	// \note In GLES2 api the source parameter type lacks one const.
	glShaderSource(m_vertShaderGL, 1, (const char**)&vertSourceCstr, DE_NULL);
	glShaderSource(m_fragShaderGL, 1, (const char**)&fragSourceCstr, DE_NULL);

	m_hasSources = true;
}